

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void handleSelectionRequest(XEvent *event)

{
  XSelectionRequestEvent *in_RDI;
  XEvent reply;
  XSelectionRequestEvent *request;
  undefined4 local_d0 [6];
  Display *local_b8;
  Window local_b0;
  Atom local_a8;
  Atom local_a0;
  Atom local_98;
  Time local_90;
  XSelectionRequestEvent *local_10;
  
  local_10 = in_RDI;
  memset(local_d0,0,0xc0);
  local_d0[0] = 0x1f;
  local_98 = writeTargetToProperty(in_RDI);
  local_b8 = local_10->display;
  local_b0 = local_10->requestor;
  local_a8 = local_10->selection;
  local_a0 = local_10->target;
  local_90 = local_10->time;
  XSendEvent(_glfw.x11.display,local_10->requestor,0,0,local_d0);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent reply = { SelectionNotify };
    reply.xselection.property = writeTargetToProperty(request);
    reply.xselection.display = request->display;
    reply.xselection.requestor = request->requestor;
    reply.xselection.selection = request->selection;
    reply.xselection.target = request->target;
    reply.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &reply);
}